

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

RepeatedPtrField<google::protobuf::Message> * __thiscall
google::protobuf::RepeatedPtrField<google::protobuf::Message>::operator=
          (RepeatedPtrField<google::protobuf::Message> *this,
          RepeatedPtrField<google::protobuf::Message> *other)

{
  if (this != other) {
    if ((this->super_RepeatedPtrFieldBase).arena_ == (other->super_RepeatedPtrFieldBase).arena_) {
      internal::RepeatedPtrFieldBase::InternalSwap
                (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
    }
    else {
      internal::RepeatedPtrFieldBase::
      CopyFrom<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
                (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
    }
  }
  return this;
}

Assistant:

inline RepeatedPtrField<Element>& RepeatedPtrField<Element>::operator=(
    RepeatedPtrField&& other) noexcept {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // the two fields are on different arenas.
  if (this != &other) {
    if (GetArena() != other.GetArena()
#ifdef PROTOBUF_FORCE_COPY_IN_MOVE
        || GetArena() == nullptr
#endif  // !PROTOBUF_FORCE_COPY_IN_MOVE
    ) {
      CopyFrom(other);
    } else {
      InternalSwap(&other);
    }
  }
  return *this;
}